

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cRGB,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  FSpecialColormap *pFVar9;
  EBlend EVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  BYTE *pBVar14;
  byte *pbVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  pFVar9 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar10 = BLEND_NONE;
  }
  else {
    EVar10 = inf->blend;
  }
  switch(EVar10) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar14 = pin + 2;
      lVar11 = 0;
      do {
        pout[lVar11 * 4 + 2] = pBVar14[-2];
        pout[lVar11 * 4 + 1] = pBVar14[-1];
        pout[lVar11 * 4] = *pBVar14;
        pout[lVar11 * 4 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        pBVar14 = pBVar14 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pbVar15 = pin + 2;
      lVar11 = 0;
      do {
        uVar17 = (uint)pbVar15[-1] * 0x8f + (uint)pbVar15[-2] * 0x4d +
                 ((uint)*pbVar15 + (uint)*pbVar15 * 8) * 4 >> 0xc;
        BVar1 = IcePalette[uVar17][1];
        pout[lVar11 * 4 + 2] = IcePalette[uVar17][0];
        pout[lVar11 * 4 + 1] = BVar1;
        pout[lVar11 * 4] = IcePalette[uVar17][2];
        pout[lVar11 * 4 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        pbVar15 = pbVar15 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pbVar15 = pin + 2;
      lVar11 = 0;
      do {
        iVar16 = inf->blendcolor[3];
        bVar3 = pbVar15[-1];
        iVar12 = inf->blendcolor[1];
        bVar2 = *pbVar15;
        iVar5 = inf->blendcolor[2];
        pout[lVar11 * 4 + 2] = (BYTE)((uint)pbVar15[-2] * iVar16 + inf->blendcolor[0] >> 0x10);
        pout[lVar11 * 4 + 1] = (BYTE)((uint)bVar3 * iVar16 + iVar12 >> 0x10);
        pout[lVar11 * 4] = (BYTE)((uint)bVar2 * iVar16 + iVar5 >> 0x10);
        pout[lVar11 * 4 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        pbVar15 = pbVar15 + step;
      } while (count != (int)lVar11);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pbVar15 = pin + 2;
      lVar11 = 0;
      do {
        bVar3 = pbVar15[-1];
        iVar16 = inf->blendcolor[1];
        bVar2 = *pbVar15;
        iVar12 = inf->blendcolor[2];
        pout[lVar11 * 4 + 2] = (BYTE)((uint)pbVar15[-2] * inf->blendcolor[0] >> 0x10);
        pout[lVar11 * 4 + 1] = (BYTE)((uint)bVar3 * iVar16 >> 0x10);
        pout[lVar11 * 4] = (BYTE)((uint)bVar2 * iVar12 >> 0x10);
        pout[lVar11 * 4 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        pbVar15 = pbVar15 + step;
      } while (count != (int)lVar11);
    }
    break;
  default:
    EVar10 = inf->blend;
    lVar11 = (long)EVar10;
    if (lVar11 < 0x21) {
      if ((BLEND_ICEMAP < EVar10) && (0 < count)) {
        iVar16 = 0x20 - EVar10;
        pbVar15 = pin + 2;
        lVar11 = 0;
        do {
          bVar3 = *pbVar15;
          iVar12 = ((uint)pbVar15[-1] * 0x8f + (uint)pbVar15[-2] * 0x4d +
                    ((uint)bVar3 + (uint)bVar3 * 8) * 4 >> 8) * (EVar10 + BLEND_MODULATE);
          lVar18 = (long)(int)((uint)pbVar15[-2] * iVar16 + iVar12) * 0x84210843;
          lVar7 = (long)(int)((uint)pbVar15[-1] * iVar16 + iVar12) * 0x84210843;
          lVar8 = (long)(int)((uint)bVar3 * iVar16 + iVar12) * 0x84210843;
          pout[lVar11 * 4 + 2] = (char)(uint)((ulong)lVar18 >> 0x24) - (char)(lVar18 >> 0x3f);
          pout[lVar11 * 4 + 1] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
          pout[lVar11 * 4] = (char)(uint)((ulong)lVar8 >> 0x24) - (char)(lVar8 >> 0x3f);
          pout[lVar11 * 4 + 3] = 0xff;
          lVar11 = lVar11 + 1;
          pbVar15 = pbVar15 + step;
        } while (count != (int)lVar11);
      }
    }
    else if (0 < count) {
      pbVar15 = pin + 2;
      lVar18 = 0;
      do {
        uVar17 = (uint)pbVar15[-1] * 0x8f + (uint)pbVar15[-2] * 0x4d +
                 ((uint)*pbVar15 + (uint)*pbVar15 * 8) * 4;
        uVar6 = uVar17 >> 8;
        uVar13 = (ulong)uVar6;
        if (0xfe < uVar6) {
          uVar13 = 0xff;
        }
        if (uVar17 < 0x100) {
          uVar13 = 0;
        }
        uVar4 = *(undefined2 *)((long)pFVar9 + uVar13 * 4 + lVar11 * 0x518 + -0xa700);
        pout[lVar18 * 4 + 2] = *(BYTE *)((long)pFVar9 + uVar13 * 4 + lVar11 * 0x518 + -0xa6fe);
        *(undefined2 *)(pout + lVar18 * 4) = uVar4;
        pout[lVar18 * 4 + 3] = 0xff;
        lVar18 = lVar18 + 1;
        pbVar15 = pbVar15 + step;
      } while (count != (int)lVar18);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}